

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

bool igVSliderInt(char *label,ImVec2 size,int *v,int v_min,int v_max,char *format)

{
  bool bVar1;
  char *format_local;
  int v_max_local;
  int v_min_local;
  int *v_local;
  char *label_local;
  ImVec2 size_local;
  
  label_local = (char *)size;
  bVar1 = ImGui::VSliderInt(label,(ImVec2 *)&label_local,v,v_min,v_max,format);
  return bVar1;
}

Assistant:

CIMGUI_API int _igVSliderInt (char *larg1, ImVec2 const *larg2, int *larg3, int larg4, int larg5, char *larg6) {
  int lresult = (int)0 ;
  char *arg1 = (char *) 0 ;
  ImVec2 arg2 ;
  int *arg3 = (int *) 0 ;
  int arg4 ;
  int arg5 ;
  char *arg6 = (char *) 0 ;
  bool result;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = larg3;
  arg4 = larg4;
  arg5 = larg5;
  arg6 = larg6;
  try {
    result = (bool)igVSliderInt((char const *)arg1,arg2,arg3,arg4,arg5,(char const *)arg6);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}